

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

void reward_untrap(trap *ttmp,monst *mtmp)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if (-1 < (char)ttmp->field_0x8) {
    uVar1 = mt_random();
    uVar1 = uVar1 % 10;
    lVar5 = (long)u.uluck;
    lVar3 = (long)u.moreluck;
    if ((int)(lVar3 + lVar5) != 0) {
      uVar2 = mt_random();
      if (SUB168(ZEXT416(uVar2) % SEXT816(0x32 - (lVar3 + lVar5)),0) != 0) {
        iVar6 = (int)u.moreluck + (int)u.uluck;
        iVar7 = iVar6 / 3;
        if (iVar6 < -5) {
          iVar7 = iVar6;
        }
        uVar2 = uVar1 - iVar7;
        uVar1 = 0;
        if ((-1 < (int)uVar2) && (uVar1 = 9, (int)uVar2 < 9)) {
          uVar1 = uVar2;
        }
      }
    }
    if (((((int)uVar1 < 8) && ((*(uint *)&mtmp->field_0x60 & 0x480000) == 0)) &&
        (mtmp->mfrozen == '\0')) &&
       (((mtmp->data->mflags1 & 0x10000) == 0 && (mtmp->data->mlet != '5')))) {
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 | 0x400000;
      set_malign(mtmp);
      pcVar4 = Monnam(mtmp);
      pline("%s is grateful.",pcVar4);
    }
    uVar1 = mt_random();
    if (uVar1 * -0x55555555 < 0x55555556) {
      uVar1 = mt_random();
      uVar1 = uVar1 & 7;
      lVar5 = (long)u.uluck;
      lVar3 = (long)u.moreluck;
      if ((int)(lVar3 + lVar5) != 0) {
        uVar2 = mt_random();
        if (SUB168(ZEXT416(uVar2) % SEXT816(0x32 - (lVar3 + lVar5)),0) != 0) {
          iVar6 = (int)u.moreluck + (int)u.uluck;
          iVar7 = iVar6 / 3;
          if (iVar6 < -5) {
            iVar7 = iVar6;
          }
          uVar2 = uVar1 - iVar7;
          uVar1 = 0;
          if ((-1 < (int)uVar2) && (uVar1 = 7, (int)uVar2 < 7)) {
            uVar1 = uVar2;
          }
        }
      }
      if ((uVar1 == 0) && (u.ualign.type == '\x01')) {
        adjalign(1);
        pline("You feel that you did the right thing.");
        return;
      }
    }
  }
  return;
}

Assistant:

static void reward_untrap(struct trap *ttmp, struct monst *mtmp)
{
	if (!ttmp->madeby_u) {
	    if (rnl(10) < 8 && !mtmp->mpeaceful &&
		    !mtmp->msleeping && !mtmp->mfrozen &&
		    !mindless(mtmp->data) &&
		    mtmp->data->mlet != S_HUMAN) {
		mtmp->mpeaceful = 1;
		set_malign(mtmp);	/* reset alignment */
		pline("%s is grateful.", Monnam(mtmp));
	    }
	    /* Helping someone out of a trap is a nice thing to do,
	     * A lawful may be rewarded, but not too often.  */
	    if (!rn2(3) && !rnl(8) && u.ualign.type == A_LAWFUL) {
		adjalign(1);
		pline("You feel that you did the right thing.");
	    }
	}
}